

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io.c
# Opt level: O2

size_t Qiniu_ReadBuf_Read(void *buf,size_t unused,size_t n,Qiniu_ReadBuf *self)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = self->off;
  sVar2 = self->limit - lVar1;
  if (sVar2 == 0 || self->limit < lVar1) {
    n = 0;
  }
  else {
    if ((long)sVar2 < (long)n) {
      n = sVar2;
    }
    memcpy(buf,self->buf + lVar1,n);
    self->off = self->off + n;
  }
  return n;
}

Assistant:

static size_t Qiniu_ReadBuf_Read(void *buf, size_t unused, size_t n, Qiniu_ReadBuf *self)
{
	Qiniu_Int64 max = self->limit - self->off;
	if (max <= 0)
	{
		return 0;
	}
	if ((Qiniu_Int64)n > max)
	{
		n = max & (~(size_t)0L);
	}
	memcpy(buf, self->buf + self->off, n);
	self->off += n;
	return n;
}